

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::FirewallOperator::process
          (FirewallOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  operations oVar2;
  type pMVar3;
  long in_RSI;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  bool res;
  Message *in_stack_ffffffffffffffa8;
  function<bool_(const_helics::Message_*)> *in_stack_ffffffffffffffb0;
  
  bVar1 = std::function::operator_cast_to_bool((function<bool_(const_helics::Message_*)> *)0x421e08)
  ;
  if (bVar1) {
    in_stack_ffffffffffffffb0 = (function<bool_(const_helics::Message_*)> *)(in_RSI + 8);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::get
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_ffffffffffffffb0);
    bVar1 = std::function<bool_(const_helics::Message_*)>::operator()
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    oVar2 = std::atomic::operator_cast_to_operations
                      ((atomic<helics::FirewallOperator::operations> *)0x421e48);
    switch(oVar2) {
    case drop:
      if (bVar1) {
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator=
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      break;
    case pass:
      if (!bVar1) {
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator=
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      break;
    case set_flag1:
      if (bVar1) {
        pMVar3 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator*
                           ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                            in_stack_ffffffffffffffb0);
        setActionFlag<helics::Message,helics::MessageFlags>(pMVar3,user_custom_message_flag1);
      }
      break;
    case set_flag2:
      if (bVar1) {
        pMVar3 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator*
                           ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                            in_stack_ffffffffffffffb0);
        setActionFlag<helics::Message,helics::MessageFlags>(pMVar3,user_custom_message_flag2);
      }
      break;
    case set_flag3:
      if (bVar1) {
        pMVar3 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator*
                           ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                            in_stack_ffffffffffffffb0);
        setActionFlag<helics::Message,helics::MessageFlags>(pMVar3,user_custom_message_flag3);
      }
      break;
    case none:
    }
  }
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffffb0,
             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffffa8);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> FirewallOperator::process(std::unique_ptr<Message> message)
{
    if (checkFunction) {
        bool res = checkFunction(message.get());
        switch (operation) {
            case operations::drop:
                if (res) {
                    message = nullptr;
                }
                break;
            case operations::pass:
                if (!res) {
                    message = nullptr;
                }
                break;
            case operations::set_flag1:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag1);
                }
                break;
            case operations::set_flag2:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag2);
                }
                break;
            case operations::set_flag3:
                if (res) {
                    setActionFlag(*message, user_custom_message_flag3);
                }
                break;
            case operations::none:
                break;
        }
    }
    return message;
}